

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

uint64_t getHouseList(int *out,uint64_t seed,int chunkX,int chunkZ)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  uint64_t in_RSI;
  uint64_t *in_RDI;
  uint64_t rng;
  uint64_t local_20;
  int n;
  
  local_20 = chunkGenerateRnd(in_RSI,in_EDX,in_ECX);
  n = (int)(in_RSI >> 0x20);
  skipNextN(&local_20,1);
  iVar1 = nextInt(in_RDI,n);
  *(int *)in_RDI = iVar1 + 2;
  iVar1 = nextInt(in_RDI,n);
  *(int *)((long)in_RDI + 4) = iVar1;
  iVar1 = nextInt(in_RDI,n);
  *(int *)(in_RDI + 1) = iVar1;
  iVar1 = nextInt(in_RDI,n);
  *(int *)((long)in_RDI + 0xc) = iVar1 + 2;
  iVar1 = nextInt(in_RDI,n);
  *(int *)(in_RDI + 2) = iVar1;
  iVar1 = nextInt(in_RDI,n);
  *(int *)((long)in_RDI + 0x14) = iVar1 + 1;
  iVar1 = nextInt(in_RDI,n);
  *(int *)(in_RDI + 3) = iVar1 + 2;
  iVar1 = nextInt(in_RDI,n);
  *(int *)((long)in_RDI + 0x1c) = iVar1;
  iVar1 = nextInt(in_RDI,n);
  *(int *)(in_RDI + 4) = iVar1;
  return local_20;
}

Assistant:

uint64_t getHouseList(int *out, uint64_t seed, int chunkX, int chunkZ)
{
    uint64_t rng = chunkGenerateRnd(seed, chunkX, chunkZ);
    skipNextN(&rng, 1);

    out[HouseSmall] = nextInt(&rng, 4 - 2 + 1) + 2;
    out[Church]     = nextInt(&rng, 1 - 0 + 1) + 0;
    out[Library]    = nextInt(&rng, 2 - 0 + 1) + 0;
    out[WoodHut]    = nextInt(&rng, 5 - 2 + 1) + 2;
    out[Butcher]    = nextInt(&rng, 2 - 0 + 1) + 0;
    out[FarmLarge]  = nextInt(&rng, 4 - 1 + 1) + 1;
    out[FarmSmall]  = nextInt(&rng, 4 - 2 + 1) + 2;
    out[Blacksmith] = nextInt(&rng, 1 - 0 + 1) + 0;
    out[HouseLarge] = nextInt(&rng, 3 - 0 + 1) + 0;

    return rng;
}